

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<4UL>
mserialize::cx_strcat<2ul,1ul,1ul>
          (cx_string<2UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2)

{
  char *pcVar1;
  size_t i;
  long lVar2;
  ulong uVar3;
  char buffer [5];
  undefined8 local_50;
  ulong auStack_48 [5];
  cx_string<2UL> *local_20;
  cx_string<1UL> *local_18;
  cx_string<1UL> *local_10;
  
  pcVar1 = buffer;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  local_20 = strings;
  local_18 = strings_1;
  local_10 = strings_2;
  auStack_48[1] = 2;
  auStack_48[2] = 1;
  auStack_48[3] = 1;
  for (lVar2 = 1; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_48[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(undefined1 *)(auStack_48[lVar2 + 4] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<4UL>::cx_string((cx_string<4UL> *)&local_50,buffer);
  return (char  [5])((uint5)local_50._4_4_ << 0x20 | (uint5)(uint)local_50);
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}